

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnMemoryFill(SharedValidator *this,Location *loc,Var *memidx)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  MemoryType mt;
  Limits local_88;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0xd2,loc);
  local_88.initial = 0;
  local_88.max._0_7_ = 0;
  local_88._15_4_ = 0;
  Var::Var(&local_70,memidx);
  RVar2 = CheckMemoryIndex(this,&local_70,(MemoryType *)&local_88);
  Var::~Var(&local_70);
  RVar3 = TypeChecker::OnMemoryFill(&this->typechecker_,&local_88);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnMemoryFill(const Location& loc, Var memidx) {
  Result result = CheckInstr(Opcode::MemoryFill, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= typechecker_.OnMemoryFill(mt.limits);
  return result;
}